

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O0

ssize_t __thiscall
kj::VectorOutputStream::write(VectorOutputStream *this,int __fd,void *__buf,size_t __n)

{
  byte *pbVar1;
  bool bVar2;
  uchar *puVar3;
  uchar *puVar4;
  undefined4 in_register_00000034;
  long local_78;
  Fault local_70;
  Fault f;
  unsigned_long *local_60;
  undefined1 local_58 [8];
  DebugComparison<unsigned_long_&,_long> _kjCondition;
  size_t size;
  VectorOutputStream *this_local;
  ArrayPtr<const_unsigned_char> src_local;
  
  this_local = (VectorOutputStream *)CONCAT44(in_register_00000034,__fd);
  src_local.ptr = (uchar *)__buf;
  _kjCondition._32_8_ =
       ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&this_local);
  puVar3 = ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)&this_local);
  if ((puVar3 == this->fillPos) &&
     (puVar3 = this->fillPos, puVar4 = Array<unsigned_char>::end(&this->vector), puVar3 != puVar4))
  {
    local_60 = (unsigned_long *)
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (unsigned_long *)&_kjCondition.result);
    puVar3 = Array<unsigned_char>::end(&this->vector);
    f.exception = (Exception *)(puVar3 + -(long)this->fillPos);
    kj::_::DebugExpression<unsigned_long&>::operator<=
              ((DebugComparison<unsigned_long_&,_long> *)local_58,
               (DebugExpression<unsigned_long&> *)&local_60,(long *)&f);
    bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_58);
    if (bVar2) {
      this->fillPos = this->fillPos + _kjCondition._32_8_;
      return (ssize_t)this;
    }
    puVar3 = Array<unsigned_char>::end(&this->vector);
    local_78 = (long)puVar3 - (long)this->fillPos;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,long>&,unsigned_long&,unsigned_char*&,long>
              (&local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io.c++"
               ,0x133,FAILED,"size <= vector.end() - fillPos",
               "_kjCondition,size, fillPos, vector.end() - fillPos",
               (DebugComparison<unsigned_long_&,_long> *)local_58,
               (unsigned_long *)&_kjCondition.result,&this->fillPos,&local_78);
    kj::_::Debug::Fault::fatal(&local_70);
  }
  puVar3 = Array<unsigned_char>::end(&this->vector);
  if ((ulong)((long)puVar3 - (long)this->fillPos) < (ulong)_kjCondition._32_8_) {
    pbVar1 = this->fillPos;
    puVar3 = Array<unsigned_char>::begin(&this->vector);
    grow(this,(size_t)(pbVar1 + (_kjCondition._32_8_ - (long)puVar3)));
  }
  pbVar1 = this->fillPos;
  puVar3 = ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)&this_local);
  memcpy(pbVar1,puVar3,_kjCondition._32_8_);
  this->fillPos = this->fillPos + _kjCondition._32_8_;
  return (ssize_t)this;
}

Assistant:

void VectorOutputStream::write(ArrayPtr<const byte> src) {
  auto size = src.size();
  if (src.begin() == fillPos && fillPos != vector.end()) {
    // Oh goody, the caller wrote directly into our buffer.
    KJ_REQUIRE(size <= vector.end() - fillPos, size, fillPos, vector.end() - fillPos);
    fillPos += size;
  } else {
    if (vector.end() - fillPos < size) {
      grow(fillPos - vector.begin() + size);
    }

    memcpy(fillPos, src.begin(), size);
    fillPos += size;
  }
}